

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall Catch::XmlReporter::testCaseEnded(XmlReporter *this,TestCaseStats *testCaseStats)

{
  int iVar1;
  XmlFormatting fmt;
  ulong uVar2;
  StringRef local_150;
  StringRef local_140;
  allocator<char> local_129;
  string local_128 [32];
  undefined1 local_108 [16];
  StringRef local_f8;
  StringRef local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [40];
  StringRef local_88;
  bool local_71;
  StringRef local_70;
  allocator<char> local_49;
  string local_48 [32];
  undefined1 local_28 [8];
  ScopedElement e;
  TestCaseStats *testCaseStats_local;
  XmlReporter *this_local;
  
  e._8_8_ = testCaseStats;
  StreamingReporterBase::testCaseEnded(&this->super_StreamingReporterBase,testCaseStats);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"OverallResult",&local_49);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_28,(string *)&this->m_xml,(XmlFormatting)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_70 = operator____sr("success",7);
  local_71 = Counts::allOk((Counts *)(e._8_8_ + 8));
  XmlWriter::ScopedElement::writeAttribute<bool,void>((ScopedElement *)local_28,local_70,&local_71);
  local_88 = operator____sr("skips",5);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long,void>
            ((ScopedElement *)local_28,local_88,(unsigned_long *)(e._8_8_ + 0x20));
  iVar1 = (*((this->super_StreamingReporterBase).super_ReporterBase.super_IEventListener.m_config)->
            _vptr_IConfig[0xb])();
  if (iVar1 == 1) {
    local_b0._24_16_ = (undefined1  [16])operator____sr("durationInSeconds",0x11);
    local_b0._16_8_ = Timer::getElapsedSeconds(&this->m_testCaseTimer);
    XmlWriter::ScopedElement::writeAttribute<double,void>
              ((ScopedElement *)local_28,(StringRef)local_b0._24_16_,(double *)(local_b0 + 0x10));
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_d0,"StdOut",&local_d1);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_b0,(string *)&this->m_xml,(XmlFormatting)local_d0);
    StringRef::StringRef(&local_f8,(string *)(e._8_8_ + 0x48));
    local_e8 = trim(local_f8);
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_b0,local_e8,Newline);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_b0);
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator(&local_d1);
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_128,"StdErr",&local_129);
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_108,(string *)&this->m_xml,(XmlFormatting)local_128)
    ;
    StringRef::StringRef(&local_150,(string *)(e._8_8_ + 0x68));
    local_140 = trim(local_150);
    XmlWriter::ScopedElement::writeText((ScopedElement *)local_108,local_140,Newline);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_108);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  fmt = operator|(Newline,Indent);
  XmlWriter::endElement(&this->m_xml,fmt);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_28);
  return;
}

Assistant:

void XmlReporter::testCaseEnded( TestCaseStats const& testCaseStats ) {
        StreamingReporterBase::testCaseEnded( testCaseStats );
        XmlWriter::ScopedElement e = m_xml.scopedElement( "OverallResult" );
        e.writeAttribute( "success"_sr, testCaseStats.totals.assertions.allOk() );
        e.writeAttribute( "skips"_sr, testCaseStats.totals.assertions.skipped );

        if ( m_config->showDurations() == ShowDurations::Always )
            e.writeAttribute( "durationInSeconds"_sr, m_testCaseTimer.getElapsedSeconds() );
        if( !testCaseStats.stdOut.empty() )
            m_xml.scopedElement( "StdOut" ).writeText( trim( StringRef(testCaseStats.stdOut) ), XmlFormatting::Newline );
        if( !testCaseStats.stdErr.empty() )
            m_xml.scopedElement( "StdErr" ).writeText( trim( StringRef(testCaseStats.stdErr) ), XmlFormatting::Newline );

        m_xml.endElement();
    }